

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseSingleMember(Parser *this,SyntaxKind parentKind)

{
  MemberSyntax *pMVar1;
  SyntaxNode *pSVar2;
  void **in_RDI;
  MemberSyntax *result;
  bool anyLocalModules;
  SyntaxNode *in_stack_00000028;
  Parser *in_stack_00000030;
  bool *in_stack_00000ce8;
  SyntaxKind in_stack_00000cf4;
  Parser *in_stack_00000cf8;
  
  pMVar1 = parseMember(in_stack_00000cf8,in_stack_00000cf4,in_stack_00000ce8);
  if (pMVar1 != (MemberSyntax *)0x0) {
    checkMemberAllowed(in_stack_00000030,in_stack_00000028,this._4_4_);
    pSVar2 = std::exchange<slang::syntax::SyntaxNode_const*,decltype(nullptr)>
                       ((SyntaxNode **)0x0,in_RDI);
    (pMVar1->super_SyntaxNode).previewNode = pSVar2;
  }
  return pMVar1;
}

Assistant:

MemberSyntax* Parser::parseSingleMember(SyntaxKind parentKind) {
    bool anyLocalModules = false;
    auto result = parseMember(parentKind, anyLocalModules);
    if (anyLocalModules)
        moduleDeclStack.pop_back();

    if (result) {
        checkMemberAllowed(*result, parentKind);
        result->previewNode = std::exchange(previewNode, nullptr);
    }

    return result;
}